

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cms_get_metric_statistics.cc
# Opt level: O1

int __thiscall
aliyun::Cms::GetMetricStatistics
          (Cms *this,CmsGetMetricStatisticsRequestType *req,
          CmsGetMetricStatisticsResponseType *response,CmsErrorInfo *error_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator *piVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  Int IVar6;
  ArrayIndex AVar7;
  char *pcVar8;
  AliRpcRequest *this_00;
  long *plVar9;
  size_t sVar10;
  Value *pVVar11;
  Value *this_01;
  size_type *psVar12;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_500;
  Value local_4e0;
  CmsGetMetricStatisticsResponseType *local_4c8;
  value_type local_4c0;
  long *local_4a0;
  long local_498;
  long local_490 [2];
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  local_480._M_string_length = 0;
  local_480.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar8 = "https";
  }
  local_4a0 = local_490;
  local_4c8 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a0,pcVar8,pcVar8 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_500);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_4e0);
  piVar2 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar2->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_4a0,local_498 + (long)local_4a0);
  std::__cxx11::string::append((char *)&local_140);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_460.field_2._M_allocated_capacity = *psVar12;
    local_460.field_2._8_8_ = plVar9[3];
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  }
  else {
    local_460.field_2._M_allocated_capacity = *psVar12;
    local_460._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_460._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar2) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar10 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar8,pcVar8 + sVar10);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_4e0,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"GetMetricStatistics","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->namespace_)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Namespace_","");
    pcVar3 = (req->namespace_)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar3,pcVar3 + (req->namespace_)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->metric_name)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"MetricName","");
    pcVar3 = (req->metric_name)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar3,pcVar3 + (req->metric_name)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->start_time)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"StartTime","");
    pcVar3 = (req->start_time)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar3,pcVar3 + (req->start_time)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->end_time)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"EndTime","");
    pcVar3 = (req->end_time)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar3,pcVar3 + (req->end_time)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->interval)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Interval","");
    pcVar3 = (req->interval)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar3,pcVar3 + (req->interval)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->dimensions)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Dimensions","");
    pcVar3 = (req->dimensions)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar3,pcVar3 + (req->dimensions)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->next_token)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"NextToken","");
    pcVar3 = (req->next_token)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar3,pcVar3 + (req->next_token)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->length)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Length","");
    pcVar3 = (req->length)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar3,pcVar3 + (req->length)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)&local_500);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar5 == 0) {
    iVar5 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_480);
    if (((0 < iVar5) && (local_480._M_string_length != 0)) &&
       (bVar4 = Json::Reader::parse(&local_140,&local_480,&local_4e0,true), bVar4)) {
      if (error_info != (CmsErrorInfo *)0x0 && iVar5 != 200) {
        bVar4 = Json::Value::isMember(&local_4e0,"RequestId");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_500,pVVar11);
        }
        else {
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_500,anon_var_dwarf_220961 + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_500);
        paVar1 = &local_500.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != paVar1) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Json::Value::isMember(&local_4e0,"Code");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"Code");
          Json::Value::asString_abi_cxx11_(&local_500,pVVar11);
        }
        else {
          local_500._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_500,anon_var_dwarf_220961 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != paVar1) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Json::Value::isMember(&local_4e0,"HostId");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"HostId");
          Json::Value::asString_abi_cxx11_(&local_500,pVVar11);
        }
        else {
          local_500._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_500,anon_var_dwarf_220961 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != paVar1) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Json::Value::isMember(&local_4e0,"Message");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"Message");
          Json::Value::asString_abi_cxx11_(&local_500,pVVar11);
        }
        else {
          local_500._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_500,anon_var_dwarf_220961 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != paVar1) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_4c8 != (CmsGetMetricStatisticsResponseType *)0x0 && iVar5 == 200) {
        bVar4 = Json::Value::isMember(&local_4e0,"NextToken");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"NextToken");
          IVar6 = Json::Value::asInt(pVVar11);
          local_4c8->next_token = IVar6;
        }
        bVar4 = Json::Value::isMember(&local_4e0,"Code");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"Code");
          Json::Value::asString_abi_cxx11_(&local_500,pVVar11);
          std::__cxx11::string::operator=((string *)&local_4c8->code,(string *)&local_500);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
        }
        bVar4 = Json::Value::isMember(&local_4e0,"Message");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"Message");
          Json::Value::asString_abi_cxx11_(&local_500,pVVar11);
          std::__cxx11::string::operator=((string *)&local_4c8->message,(string *)&local_500);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
        }
        bVar4 = Json::Value::isMember(&local_4e0,"TraceId");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"TraceId");
          Json::Value::asString_abi_cxx11_(&local_500,pVVar11);
          std::__cxx11::string::operator=((string *)&local_4c8->trace_id,(string *)&local_500);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
        }
        bVar4 = Json::Value::isMember(&local_4e0,"Datapoints");
        if (bVar4) {
          pVVar11 = Json::Value::operator[](&local_4e0,"Datapoints");
          bVar4 = Json::Value::isMember(pVVar11,"Datapoint");
          if (bVar4) {
            pVVar11 = Json::Value::operator[](&local_4e0,"Datapoints");
            pVVar11 = Json::Value::operator[](pVVar11,"Datapoint");
            bVar4 = Json::Value::isArray(pVVar11);
            if ((bVar4) && (AVar7 = Json::Value::size(pVVar11), AVar7 != 0)) {
              index = 0;
              do {
                local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
                local_4c0._M_string_length = 0;
                local_4c0.field_2._M_local_buf[0] = '\0';
                this_01 = Json::Value::operator[](pVVar11,index);
                Json::Value::asString_abi_cxx11_(&local_500,this_01);
                std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_500);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_500._M_dataplus._M_p != &local_500.field_2) {
                  operator_delete(local_500._M_dataplus._M_p,
                                  local_500.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4c8->datapoints,&local_4c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
                  operator_delete(local_4c0._M_dataplus._M_p,
                                  CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,
                                           local_4c0.field_2._M_local_buf[0]) + 1);
                }
                AVar7 = Json::Value::size(pVVar11);
                index = index + 1;
              } while (index < AVar7);
            }
          }
        }
      }
      goto LAB_00133c04;
    }
    if (error_info == (CmsErrorInfo *)0x0) goto LAB_00133bff;
    pcVar8 = "parse response failed";
  }
  else {
    if (error_info == (CmsErrorInfo *)0x0) {
LAB_00133bff:
      iVar5 = -1;
      goto LAB_00133c04;
    }
    pcVar8 = "connect to host failed";
  }
  iVar5 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar8);
LAB_00133c04:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_4e0);
  if (local_4a0 != local_490) {
    operator_delete(local_4a0,local_490[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,
                    CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                             local_480.field_2._M_local_buf[0]) + 1);
  }
  return iVar5;
}

Assistant:

int Cms::GetMetricStatistics(const CmsGetMetricStatisticsRequestType& req,
                      CmsGetMetricStatisticsResponseType* response,
                       CmsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","GetMetricStatistics");
  if(!req.namespace_.empty()) {
    req_rpc->AddRequestQuery("Namespace_", req.namespace_);
  }
  if(!req.metric_name.empty()) {
    req_rpc->AddRequestQuery("MetricName", req.metric_name);
  }
  if(!req.start_time.empty()) {
    req_rpc->AddRequestQuery("StartTime", req.start_time);
  }
  if(!req.end_time.empty()) {
    req_rpc->AddRequestQuery("EndTime", req.end_time);
  }
  if(!req.interval.empty()) {
    req_rpc->AddRequestQuery("Interval", req.interval);
  }
  if(!req.dimensions.empty()) {
    req_rpc->AddRequestQuery("Dimensions", req.dimensions);
  }
  if(!req.next_token.empty()) {
    req_rpc->AddRequestQuery("NextToken", req.next_token);
  }
  if(!req.length.empty()) {
    req_rpc->AddRequestQuery("Length", req.length);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}